

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest3::executeTest
          (NegativeTest3 *this,_shader_stage *shader_stage)

{
  code *pcVar1;
  undefined1 auVar2 [8];
  TestLog TVar3;
  int iVar4;
  GLenum GVar5;
  GLuint GVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  TestError *this_00;
  size_t sVar9;
  char *pcVar10;
  GLint compile_status;
  string body;
  char *body_raw_ptr;
  qpTestLog *local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  char *local_1b8;
  undefined1 local_1b0 [8];
  qpTestLog *local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar8;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  pcVar1 = *(code **)(lVar8 + 0x3f0);
  GVar5 = Utils::getGLenumForShaderStage(shader_stage);
  GVar6 = (*pcVar1)(GVar5);
  this->m_so_id = GVar6;
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2cd9);
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  local_1c8 = '\0';
  local_1b8 = (char *)0x0;
  switch(*shader_stage) {
  case SHADER_STAGE_FIRST:
    local_1b0 = (undefined1  [8])local_1a0;
    local_1e0 = (qpTestLog *)0x121;
    local_1b0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_1e0);
    local_1a0[0].m_log = local_1e0;
    pcVar10 = 
    "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void testSubroutineType(inout vec4 test);\n\nvoid testSubroutine1(inout vec4 test)\n{\n    test += vec4(0, 1, 2, 3);\n}\n\nuniform testSubroutineType subroutineFunction;\n\nvoid main()\n{\n    subroutineFunction(gl_Position);\n}\n"
    ;
    sVar9 = 0x121;
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    local_1b0 = (undefined1  [8])local_1a0;
    local_1e0 = (qpTestLog *)0x187;
    local_1b0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_1e0);
    local_1a0[0].m_log = local_1e0;
    pcVar10 = 
    "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(vertices=4) out;\n\nsubroutine void testSubroutineType(inout vec4 test);\n\nvoid testSubroutine1(inout vec4 test)\n{\n    test += vec4(1, 2, 3, 4);\n}\n\nuniform testSubroutineType subroutineFunction;\n\nvoid main()\n{\n    vec4 test = vec4(0, 1, 2, 3);\n\n    subroutineFunction(test);\n\n    gl_out[gl_InvocationID].gl_Position = test;\n}\n"
    ;
    sVar9 = 0x187;
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    local_1b0 = (undefined1  [8])local_1a0;
    local_1e0 = (qpTestLog *)0x169;
    local_1b0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_1e0);
    local_1a0[0].m_log = local_1e0;
    pcVar10 = 
    "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(quads) in;\n\nsubroutine void testSubroutineType(inout vec4 test);\n\nvoid testSubroutine1(inout vec4 test)\n{\n    test += vec4(2, 3, 4, 5);\n}\n\nuniform testSubroutineType subroutineFunction;\n\nvoid main()\n{\n    vec4 test = vec4(1, 2, 3, 4);\n\n    subroutineFunction(test);\n\n    gl_Position = test;\n}\n"
    ;
    sVar9 = 0x169;
    break;
  case SHADER_STAGE_GEOMETRY:
    local_1b0 = (undefined1  [8])local_1a0;
    local_1e0 = (qpTestLog *)0x1b4;
    local_1b0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_1e0);
    local_1a0[0].m_log = local_1e0;
    pcVar10 = 
    "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nsubroutine void testSubroutineType(inout vec4 test);\n\nvoid testSubroutine1(inout vec4 test)\n{\n    test += vec4(3, 4, 5, 6);\n}\n\nuniform testSubroutineType subroutineFunction;\n\nvoid main()\n{\n    vec4 test = vec4(2, 3, 4, 5);\n\n    subroutineFunction(test);\n\n    gl_Position = test;\n    EmitVertex();\n}\n"
    ;
    sVar9 = 0x1b4;
    break;
  case SHADER_STAGE_FRAGMENT:
    local_1b0 = (undefined1  [8])local_1a0;
    local_1e0 = (qpTestLog *)0x174;
    local_1b0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_1e0);
    local_1a0[0].m_log = local_1e0;
    pcVar10 = 
    "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void testSubroutineType(inout vec4 test);\n\nvoid testSubroutine1(inout vec4 test)\n{\n    test += vec4(3, 4, 5, 6);\n}\n\nuniform testSubroutineType subroutineFunction;\nout     vec4               result;\n\nvoid main()\n{\n    vec4 test = vec4(2, 3, 4, 5);\n\n    subroutineFunction(test);\n\n    result = test;\n}\n"
    ;
    sVar9 = 0x174;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader stage requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2cf3);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  TVar3.m_log = local_1a0[0].m_log;
  auVar2 = local_1b0;
  local_1e0 = local_1a0[0].m_log;
  memcpy((void *)local_1b0,pcVar10,sVar9);
  *(undefined1 *)((long)&(TVar3.m_log)->flags + (long)(qpTestLog **)auVar2) = 0;
  local_1a8 = TVar3.m_log;
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
  local_1b8 = local_1d8;
  (**(code **)(lVar8 + 0x12b8))(this->m_so_id,1,&local_1b8,0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2cfa);
  local_1e0 = (qpTestLog *)((ulong)local_1e0 & 0xffffffff00000000);
  (**(code **)(lVar8 + 0x248))(this->m_so_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d00);
  (**(code **)(lVar8 + 0xa70))(this->m_so_id,0x8b81,&local_1e0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d03);
  if ((int)local_1e0 == 1) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "The following shader was expected to fail to compile but was accepted by the compiler:\n\n"
               ,0x58);
    pcVar10 = local_1d8;
    if (local_1d8 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-1].outputFile);
    }
    else {
      sVar9 = strlen(local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar9);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  (**(code **)(lVar8 + 0x470))(this->m_so_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glDeleteShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d11);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  return;
}

Assistant:

void NegativeTest3::executeTest(const Utils::_shader_stage& shader_stage)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate a new shader object */
	m_so_id = gl.createShader(Utils::getGLenumForShaderStage(shader_stage));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Assign body to the shader */
	std::string body;
	const char* body_raw_ptr = DE_NULL;

	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_VERTEX:
		body = getVertexShaderBody();
		break;
	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
		body = getTessellationControlShaderBody();
		break;
	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
		body = getTessellationEvaluationShaderBody();
		break;
	case Utils::SHADER_STAGE_GEOMETRY:
		body = getGeometryShaderBody();
		break;
	case Utils::SHADER_STAGE_FRAGMENT:
		body = getFragmentShaderBody();
		break;

	default:
	{
		TCU_FAIL("Unrecognized shader stage requested");
	}
	} /* switch (shader_stage) */

	body_raw_ptr = body.c_str();

	gl.shaderSource(m_so_id, 1 /* count */, &body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Try to compile the shader */
	glw::GLint compile_status = 0;

	gl.compileShader(m_so_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_so_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status == GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "The following shader was expected to fail to compile but was "
													   "accepted by the compiler:\n"
													   "\n"
						   << body.c_str() << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* Good to release the shader at this point */
	gl.deleteShader(m_so_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
}